

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_element_generic(lysp_yin_ctx *ctx,ly_stmt parent_stmt,lysp_stmt **element)

{
  int iVar1;
  LY_ERR LVar2;
  ly_stmt current_element;
  ly_stmt lVar3;
  lysp_stmt *plVar4;
  size_t sVar5;
  char *pcVar6;
  lysp_stmt *str_p;
  lysp_stmt **pplVar7;
  ly_ctx *plVar8;
  uint uVar9;
  yin_argument arg_type;
  lyxml_ctx *plVar10;
  char *pcVar11;
  char **arg_val;
  char *id;
  lysp_stmt *local_40;
  char *local_38;
  
  local_40 = (lysp_stmt *)0x0;
  if (ctx->xmlctx->status != LYXML_ELEMENT) {
    __assert_fail("ctx->xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0xc9e,
                  "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                 );
  }
  plVar4 = (lysp_stmt *)calloc(1,0x38);
  *element = plVar4;
  plVar10 = ctx->xmlctx;
  if (plVar4 == (lysp_stmt *)0x0) {
    plVar8 = plVar10->ctx;
LAB_00181b8a:
    ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_element_generic");
    return LY_EMEM;
  }
  if ((plVar10->field_4).prefix_len == 0) {
    LVar2 = lydict_insert(plVar10->ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                          (char **)plVar4);
  }
  else {
    iVar1 = asprintf(&local_38,"%.*s:%.*s",(plVar10->field_4).prefix_len,(plVar10->field_3).prefix,
                     (plVar10->field_6).name_len,(plVar10->field_5).name);
    plVar8 = ctx->xmlctx->ctx;
    if (iVar1 == -1) goto LAB_00181b8a;
    LVar2 = lydict_insert_zc(plVar8,local_38,&(*element)->stmt);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    plVar10 = ctx->xmlctx;
    plVar8 = plVar10->ctx;
    plVar4 = *element;
    pcVar11 = plVar4->stmt;
    sVar5 = strlen(pcVar11);
    LVar2 = ly_store_prefix_data
                      (plVar8,pcVar11,sVar5,LY_VALUE_XML,&plVar10->ns,&plVar4->format,
                       &plVar4->prefix_data);
  }
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  plVar10 = ctx->xmlctx;
  current_element =
       yin_match_keyword(ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                         (plVar10->field_3).prefix,(plVar10->field_4).prefix_len,parent_stmt);
  plVar4 = *element;
  plVar4->kw = current_element;
  str_p = plVar4->child;
  if (current_element == LY_STMT_EXTENSION_INSTANCE) {
    LVar2 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    plVar10 = ctx->xmlctx;
    plVar4 = str_p;
    if (plVar10->status == LYXML_ATTRIBUTE) {
      do {
        str_p = (lysp_stmt *)calloc(1,0x38);
        if (str_p == (lysp_stmt *)0x0) {
          plVar8 = plVar10->ctx;
          goto LAB_00181b8a;
        }
        pplVar7 = &plVar4->next;
        if ((*element)->child == (lysp_stmt *)0x0) {
          pplVar7 = &(*element)->child;
        }
        *pplVar7 = str_p;
        str_p->flags = 0x400;
        LVar2 = lydict_insert(plVar10->ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                              (char **)str_p);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        str_p->kw = LY_STMT_NONE;
        pcVar11 = (ctx->xmlctx->field_3).prefix;
        LVar2 = lyxml_ctx_next(ctx->xmlctx);
        if (pcVar11 == (char *)0x0) {
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          plVar10 = ctx->xmlctx;
          if ((plVar10->field_6).dynamic == '\0') {
            pcVar11 = "";
            if ((plVar10->field_4).prefix_len != 0) {
              pcVar11 = (plVar10->field_3).prefix;
            }
            LVar2 = lydict_insert(plVar10->ctx,pcVar11,(plVar10->field_4).prefix_len,&str_p->arg);
          }
          else {
            LVar2 = lydict_insert_zc(plVar10->ctx,(plVar10->field_3).prefix,&str_p->arg);
          }
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          (ctx->xmlctx->field_6).dynamic = '\0';
          if (str_p->arg == (char *)0x0) {
            return LY_EMEM;
          }
        }
        else if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        LVar2 = lyxml_ctx_next(ctx->xmlctx);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        plVar10 = ctx->xmlctx;
        plVar4 = str_p;
      } while (plVar10->status == LYXML_ATTRIBUTE);
    }
    else {
      plVar4 = (lysp_stmt *)0x0;
    }
LAB_00182413:
    local_40 = plVar4;
    plVar10 = ctx->xmlctx;
    if ((plVar10->status == LYXML_ELEM_CONTENT) && ((plVar10->field_5).ws_only == '\0')) {
      if ((plVar10->field_4).prefix_len != 0) {
        if ((plVar10->field_6).dynamic == '\0') {
          LVar2 = lydict_insert(plVar10->ctx,(plVar10->field_3).prefix,(plVar10->field_4).prefix_len
                                ,&(*element)->arg);
        }
        else {
          LVar2 = lydict_insert_zc(plVar10->ctx,(plVar10->field_3).prefix,&(*element)->arg);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        (ctx->xmlctx->field_6).dynamic = '\0';
        plVar4 = *element;
        pcVar11 = plVar4->arg;
        if (pcVar11 == (char *)0x0) {
          return LY_EMEM;
        }
        plVar10 = ctx->xmlctx;
        plVar8 = plVar10->ctx;
        sVar5 = strlen(pcVar11);
        LVar2 = ly_store_prefix_data
                          (plVar8,pcVar11,sVar5,LY_VALUE_XML,&plVar10->ns,&plVar4->format,
                           &plVar4->prefix_data);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        plVar10 = ctx->xmlctx;
      }
      LVar2 = lyxml_ctx_next(plVar10);
    }
    else {
      LVar2 = lyxml_ctx_next(plVar10);
      if (LVar2 == LY_SUCCESS) {
        do {
          if (ctx->xmlctx->status != LYXML_ELEMENT) {
            return LY_SUCCESS;
          }
          LVar2 = yin_parse_element_generic(ctx,(*element)->kw,&local_40);
          plVar4 = local_40;
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          pplVar7 = &str_p->next;
          if ((*element)->child == (lysp_stmt *)0x0) {
            pplVar7 = &(*element)->child;
          }
          *pplVar7 = local_40;
          if (ctx->xmlctx->status != LYXML_ELEM_CLOSE) {
            __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CLOSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                          ,0xcf0,
                          "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                         );
          }
          LVar2 = lyxml_ctx_next(ctx->xmlctx);
          str_p = plVar4;
        } while (LVar2 == LY_SUCCESS);
      }
    }
  }
  else {
    if (current_element == LY_STMT_NONE) {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      uVar9 = *(uint *)&ctx->xmlctx->field_6;
      pcVar11 = (ctx->xmlctx->field_5).name;
      current_element = parent_stmt;
      goto LAB_00181c3a;
    }
    LVar2 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    arg_val = &plVar4->arg;
    if ((int)current_element < 0x140000) {
      if ((int)current_element < 0x20000) {
        if ((int)current_element < 0x200) {
          if ((int)current_element < 0x10) {
            switch(current_element) {
            case LY_STMT_NOTIFICATION:
            case LY_STMT_ACTION:
              goto switchD_0018203d_caseD_1;
            case LY_STMT_INPUT:
            case LY_STMT_OUTPUT:
              arg_type = YIN_ARG_NONE;
              goto LAB_00182406;
            default:
              goto switchD_0018203d_caseD_3;
            }
          }
          if ((0x30 < current_element - LY_STMT_RPC) ||
             ((0x1000000010001U >> ((ulong)(current_element - LY_STMT_RPC) & 0x3f) & 1) == 0)) {
            if (current_element == LY_STMT_AUGMENT) {
LAB_00182272:
              arg_type = YIN_ARG_TARGET_NODE;
              goto LAB_00182406;
            }
            if (current_element != LY_STMT_CASE) goto switchD_0018203d_caseD_3;
          }
          goto switchD_0018203d_caseD_1;
        }
        if ((int)current_element < 0x2000) {
          if ((int)current_element < 0x800) {
            if ((current_element == LY_STMT_CHOICE) || (current_element == LY_STMT_CONTAINER)) {
switchD_0018203d_caseD_1:
              arg_type = YIN_ARG_NAME;
LAB_00182406:
              LVar2 = yin_parse_attribute(ctx,arg_type,arg_val,Y_MAYBE_STR_ARG,current_element);
              plVar4 = local_40;
              if (LVar2 != LY_SUCCESS) {
                return LVar2;
              }
              goto LAB_00182413;
            }
          }
          else if ((current_element == LY_STMT_GROUPING) || (current_element == LY_STMT_LEAF))
          goto switchD_0018203d_caseD_1;
        }
        else if ((int)current_element < 0x8000) {
          if ((current_element == LY_STMT_LEAF_LIST) || (current_element == LY_STMT_LIST))
          goto switchD_0018203d_caseD_1;
        }
        else if ((current_element == LY_STMT_USES) || (current_element == LY_STMT_ARGUMENT))
        goto switchD_0018203d_caseD_1;
      }
      else {
        if (0x9ffff < (int)current_element) {
          if ((int)current_element < 0xe0000) {
            if ((int)current_element < 0xc0000) {
              if (current_element == LY_STMT_DEVIATION) goto LAB_00182272;
              if (current_element == LY_STMT_ENUM) goto switchD_0018203d_caseD_1;
            }
            else {
              if (current_element == LY_STMT_ERROR_APP_TAG) goto LAB_001823e9;
              if (current_element == LY_STMT_ERROR_MESSAGE) goto LAB_00182312;
            }
          }
          else if ((int)current_element < 0x110000) {
            if ((current_element == LY_STMT_EXTENSION) || (current_element == LY_STMT_FEATURE))
            goto switchD_0018203d_caseD_1;
          }
          else {
            if (current_element == LY_STMT_FRACTION_DIGITS) goto LAB_001823e9;
            if ((current_element == LY_STMT_IDENTITY) || (current_element == LY_STMT_IF_FEATURE))
            goto switchD_0018203d_caseD_1;
          }
          goto switchD_0018203d_caseD_3;
        }
        if ((int)current_element < 0x60000) {
          if ((int)current_element < 0x40000) {
            if (current_element == LY_STMT_BASE) goto switchD_0018203d_caseD_1;
            if (current_element == LY_STMT_BELONGS_TO) goto LAB_00181fd2;
          }
          else {
            if (current_element == LY_STMT_BIT) goto switchD_0018203d_caseD_1;
            if (current_element == LY_STMT_CONFIG) goto LAB_001823e9;
          }
        }
        else if ((int)current_element < 0x80000) {
          if (current_element == LY_STMT_CONTACT) {
LAB_00182312:
            LVar2 = yin_parse_attribute(ctx,YIN_ARG_NONE,arg_val,Y_MAYBE_STR_ARG,current_element);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            plVar10 = ctx->xmlctx;
            if (plVar10->status != LYXML_ELEM_CONTENT) {
              __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CONTENT",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                            ,0xc65,
                            "LY_ERR yin_parse_extension_instance_arg(struct lysp_yin_ctx *, enum ly_stmt, const char **)"
                           );
            }
            if ((plVar10->field_5).ws_only == '\0') {
LAB_00182361:
              plVar8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              pcVar11 = "text";
              if (current_element == LY_STMT_ERROR_MESSAGE) {
                pcVar11 = "value";
              }
              pcVar6 = lyplg_ext_stmt2str(current_element);
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YIN,
                      "Sub-element \"%s\" of \"%s\" element must be defined as it\'s first sub-element."
                      ,pcVar11,pcVar6);
              return LY_EVALID;
            }
            LVar2 = lyxml_ctx_next(plVar10);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            plVar10 = ctx->xmlctx;
            if (plVar10->status != LYXML_ELEMENT) goto LAB_00182361;
            lVar3 = yin_match_keyword(ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                                      (plVar10->field_3).prefix,(plVar10->field_4).prefix_len,
                                      current_element);
            if (((current_element == LY_STMT_ERROR_MESSAGE) && (lVar3 != LY_STMT_ARG_VALUE)) ||
               ((current_element != LY_STMT_ERROR_MESSAGE && (lVar3 != LY_STMT_ARG_TEXT)))) {
              plVar8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              uVar9 = *(uint *)&ctx->xmlctx->field_6;
              pcVar11 = (ctx->xmlctx->field_5).name;
LAB_00181c3a:
              pcVar6 = lyplg_ext_stmt2str(current_element);
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YIN,
                      "Unexpected sub-element \"%.*s\" of \"%s\" element.",(ulong)uVar9,pcVar11,
                      pcVar6);
              return LY_EVALID;
            }
            LVar2 = lyxml_ctx_next(ctx->xmlctx);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            while (plVar10 = ctx->xmlctx, plVar10->status == LYXML_ATTRIBUTE) {
              LVar2 = lyxml_ctx_next(plVar10);
              if (LVar2 != LY_SUCCESS) {
                return LVar2;
              }
              LVar2 = lyxml_ctx_next(ctx->xmlctx);
              if (LVar2 != LY_SUCCESS) {
                return LVar2;
              }
            }
            if ((plVar10->field_6).dynamic == '\0') {
              if ((plVar10->field_4).prefix_len == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (plVar10->field_3).prefix;
              }
              LVar2 = lydict_insert(plVar10->ctx,pcVar11,(plVar10->field_4).prefix_len,arg_val);
            }
            else {
              LVar2 = lydict_insert_zc(plVar10->ctx,(plVar10->field_3).prefix,arg_val);
            }
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            (ctx->xmlctx->field_6).dynamic = '\0';
            if (*arg_val == (char *)0x0) {
              return LY_EMEM;
            }
            LVar2 = lyxml_ctx_next(ctx->xmlctx);
            plVar4 = local_40;
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            goto LAB_00182413;
          }
          if (current_element == LY_STMT_DEFAULT) goto LAB_001823e9;
        }
        else {
          if (current_element == LY_STMT_DESCRIPTION) goto LAB_00182312;
          if (current_element == LY_STMT_DEVIATE) goto LAB_001823e9;
        }
      }
    }
    else if ((int)current_element < 0x250000) {
      if ((int)current_element < 0x1c0000) {
        if ((int)current_element < 0x180000) {
          if ((int)current_element < 0x160000) {
            if ((current_element == LY_STMT_IMPORT) || (current_element == LY_STMT_INCLUDE)) {
LAB_00181fd2:
              arg_type = YIN_ARG_MODULE;
              goto LAB_00182406;
            }
          }
          else if ((current_element == LY_STMT_KEY) || (current_element == LY_STMT_LENGTH))
          goto LAB_001823e9;
        }
        else if ((int)current_element < 0x1a0000) {
          if ((current_element == LY_STMT_MANDATORY) || (current_element == LY_STMT_MAX_ELEMENTS)) {
LAB_001823e9:
            arg_type = YIN_ARG_VALUE;
            goto LAB_00182406;
          }
        }
        else if ((current_element == LY_STMT_MIN_ELEMENTS) || (current_element == LY_STMT_MODIFIER))
        goto LAB_001823e9;
      }
      else if ((int)current_element < 0x200000) {
        if ((int)current_element < 0x1e0000) {
          if (current_element == LY_STMT_MODULE) goto switchD_0018203d_caseD_1;
          if (current_element == LY_STMT_MUST) goto LAB_00182073;
        }
        else {
          if (current_element == LY_STMT_NAMESPACE) {
            arg_type = YIN_ARG_URI;
            current_element = LY_STMT_NAMESPACE;
            goto LAB_00182406;
          }
          if (current_element == LY_STMT_ORDERED_BY) goto LAB_001823e9;
        }
      }
      else if ((int)current_element < 0x220000) {
        if (current_element == LY_STMT_ORGANIZATION) goto LAB_00182312;
        if (current_element == LY_STMT_PATH) goto LAB_001823e9;
      }
      else if (((current_element == LY_STMT_PATTERN) || (current_element == LY_STMT_POSITION)) ||
              (current_element == LY_STMT_PREFIX)) goto LAB_001823e9;
    }
    else {
      if ((int)current_element < 0x2d0000) {
        if ((int)current_element < 0x290000) {
          if ((int)current_element < 0x270000) {
            if ((current_element == LY_STMT_PRESENCE) || (current_element == LY_STMT_RANGE))
            goto LAB_001823e9;
          }
          else {
            if (current_element == LY_STMT_REFERENCE) goto LAB_00182312;
            if (current_element == LY_STMT_REFINE) goto LAB_00182272;
          }
          goto switchD_0018203d_caseD_3;
        }
        if ((int)current_element < 0x2b0000) {
          if (current_element != LY_STMT_REQUIRE_INSTANCE) {
            if (current_element != LY_STMT_REVISION) goto switchD_0018203d_caseD_3;
LAB_00182541:
            arg_type = YIN_ARG_DATE;
            goto LAB_00182406;
          }
        }
        else {
          if (current_element == LY_STMT_REVISION_DATE) goto LAB_00182541;
          if (current_element != LY_STMT_STATUS) goto switchD_0018203d_caseD_3;
        }
        goto LAB_001823e9;
      }
      if ((int)current_element < 0x310000) {
        if ((int)current_element < 0x2f0000) {
          if ((current_element == LY_STMT_SUBMODULE) || (current_element == LY_STMT_TYPE))
          goto switchD_0018203d_caseD_1;
        }
        else {
          if (current_element == LY_STMT_TYPEDEF) goto switchD_0018203d_caseD_1;
          if (current_element == LY_STMT_UNIQUE) {
            arg_type = YIN_ARG_TAG;
            current_element = LY_STMT_UNIQUE;
            goto LAB_00182406;
          }
        }
      }
      else if ((int)current_element < 0x330000) {
        if (current_element == LY_STMT_UNITS) goto switchD_0018203d_caseD_1;
        if (current_element == LY_STMT_VALUE) goto LAB_001823e9;
      }
      else {
        if (current_element == LY_STMT_WHEN) {
LAB_00182073:
          arg_type = YIN_ARG_CONDITION;
          goto LAB_00182406;
        }
        if ((current_element == LY_STMT_YANG_VERSION) || (current_element == LY_STMT_YIN_ELEMENT))
        goto LAB_001823e9;
      }
    }
switchD_0018203d_caseD_3:
    LVar2 = LY_EINT;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c",
           0xc88);
  }
  return LVar2;
}

Assistant:

LY_ERR
yin_parse_element_generic(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_stmt **element)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_stmt *last = NULL, *new = NULL;
    char *id;

    assert(ctx->xmlctx->status == LYXML_ELEMENT);

    /* allocate new structure for element */
    *element = calloc(1, sizeof(**element));
    LY_CHECK_ERR_GOTO(!(*element), LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);

    /* store identifier */
    if (ctx->xmlctx->prefix_len) {
        if (asprintf(&id, "%.*s:%.*s", (int)ctx->xmlctx->prefix_len, ctx->xmlctx->prefix, (int)ctx->xmlctx->name_len,
                ctx->xmlctx->name) == -1) {
            LOGMEM(ctx->xmlctx->ctx);
            ret = LY_EMEM;
            goto cleanup;
        }
        LY_CHECK_GOTO(ret = lydict_insert_zc(ctx->xmlctx->ctx, id, &(*element)->stmt), cleanup);

        /* store prefix data for the statement */
        LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->stmt, strlen((*element)->stmt), LY_VALUE_XML,
                &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
    } else {
        LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &(*element)->stmt), cleanup);
    }

    (*element)->kw = yin_match_keyword(ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, ctx->xmlctx->prefix,
            ctx->xmlctx->prefix_len, parent_stmt);

    last = (*element)->child;
    if ((*element)->kw == LY_STMT_NONE) {
        /* unrecognized element */
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_UNEXP_SUBELEM, (int)ctx->xmlctx->name_len, ctx->xmlctx->name,
                lyplg_ext_stmt2str(parent_stmt));
        ret = LY_EVALID;
        goto cleanup;
    } else if ((*element)->kw != LY_STMT_EXTENSION_INSTANCE) {
        /* element is known yang keyword, which means argument can be parsed correctly. */
        ret = yin_parse_extension_instance_arg(ctx, (*element)->kw, &(*element)->arg);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

        /* load attributes in generic way, save all attributes in linked list */
        while (ctx->xmlctx->status == LYXML_ATTRIBUTE) {
            new = calloc(1, sizeof(*last));
            LY_CHECK_ERR_GOTO(!new, LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            last->flags |= LYS_YIN_ATTR;
            LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &last->stmt), cleanup);
            last->kw = LY_STMT_NONE;
            /* attributes with prefix are ignored */
            if (!ctx->xmlctx->prefix) {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

                INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, last->arg);
                LY_CHECK_ERR_GOTO(!last->arg, ret = LY_EMEM, cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
            }
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    }

    if ((ctx->xmlctx->status != LYXML_ELEM_CONTENT) || ctx->xmlctx->ws_only) {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        while (ctx->xmlctx->status == LYXML_ELEMENT) {
            /* parse subelements */
            ret = yin_parse_element_generic(ctx, (*element)->kw, &new);
            LY_CHECK_GOTO(ret, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            assert(ctx->xmlctx->status == LYXML_ELEM_CLOSE);
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    } else {
        /* save element content */
        if (ctx->xmlctx->value_len) {
            INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, (*element)->arg);
            LY_CHECK_ERR_GOTO(!(*element)->arg, ret = LY_EMEM, cleanup);

            /* store prefix data for the argument as well */
            LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->arg, strlen((*element)->arg), LY_VALUE_XML,
                    &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
        }

        /* read closing tag */
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    }

cleanup:
    return ret;
}